

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O3

REF_STATUS ref_histogram_free(REF_HISTOGRAM ref_histogram)

{
  if (ref_histogram != (REF_HISTOGRAM)0x0) {
    if ((FILE *)ref_histogram->df != (FILE *)0x0) {
      fclose((FILE *)ref_histogram->df);
    }
    if (ref_histogram->stats != (REF_DBL *)0x0) {
      free(ref_histogram->stats);
    }
    if (ref_histogram->bins != (REF_INT *)0x0) {
      free(ref_histogram->bins);
    }
    free(ref_histogram);
    return 0;
  }
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_free(REF_HISTOGRAM ref_histogram) {
  if (NULL == (void *)ref_histogram) return REF_NULL;
  if (NULL != ref_histogram->df) fclose(ref_histogram->df);
  ref_free(ref_histogram->stats);
  ref_free(ref_histogram->bins);
  ref_free(ref_histogram);
  return REF_SUCCESS;
}